

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2ece268::PeerManagerImpl::PushNodeVersion
          (PeerManagerImpl *this,CNode *pnode,Peer *peer)

{
  CConnman *this_00;
  string msg_type;
  bool bVar1;
  time_point tVar2;
  Logger *pLVar3;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  unsigned_long *args_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  SerParams *local_180;
  CService *local_178;
  bool tx_relay;
  uint64_t your_services;
  NodeId nodeid;
  int nNodeStartingHeight;
  uint64_t nonce;
  int64_t nTime;
  uint64_t my_services;
  direct_or_indirect local_138;
  uint local_128;
  long *local_110;
  undefined8 local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  undefined8 uStack_f8;
  CService addr_you;
  CAddress addr;
  long *local_90;
  undefined8 local_88;
  long local_80;
  undefined8 uStack_78;
  undefined1 local_70 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  my_services = peer->m_our_services;
  tVar2 = NodeClock::now();
  nTime = (long)tVar2.__d.__r / 1000000000;
  nonce = pnode->nLocalHostNonce;
  nNodeStartingHeight = (this->m_best_height).super___atomic_base<int>._M_i;
  nodeid = pnode->id;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&pnode->addr);
  addr.super_CService.super_CNetAddr.m_net = (pnode->addr).super_CService.super_CNetAddr.m_net;
  addr.super_CService.super_CNetAddr.m_scope_id =
       (pnode->addr).super_CService.super_CNetAddr.m_scope_id;
  addr.super_CService.port = (pnode->addr).super_CService.port;
  addr.nTime.__d.__r = (duration)(pnode->addr).nTime.__d.__r;
  addr.nServices = (pnode->addr).nServices;
  bVar1 = CNetAddr::IsRoutable((CNetAddr *)&addr);
  if (bVar1) {
    bVar1 = IsProxy((CNetAddr *)&addr);
    if (!bVar1) {
      bVar1 = CNetAddr::IsAddrV1Compatible((CNetAddr *)&addr);
      if (bVar1) {
        prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_you,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
        addr_you.super_CNetAddr.m_net = addr.super_CService.super_CNetAddr.m_net;
        addr_you.super_CNetAddr.m_scope_id = addr.super_CService.super_CNetAddr.m_scope_id;
        addr_you.port = addr.super_CService.port;
        goto LAB_008fe79f;
      }
    }
  }
  CService::CService(&addr_you);
LAB_008fe79f:
  your_services = addr.nServices;
  if ((pnode->m_conn_type - FEELER < 2) ||
     (((this->m_opts).ignore_incoming_txs == true && ((pnode->m_permission_flags & Relay) == None)))
     ) {
    tx_relay = false;
  }
  else {
    tx_relay = true;
  }
  local_110 = (long *)&local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"version","");
  local_180 = &CNetAddr::V1;
  local_178 = &addr_you;
  args_7 = (unsigned_long *)0x8fe821;
  CService::CService((CService *)&local_138.indirect_contents);
  this_00 = this->m_connman;
  local_90 = &local_80;
  if (local_110 == (long *)&local_100) {
    uStack_78 = uStack_f8;
  }
  else {
    local_90 = local_110;
  }
  local_80 = CONCAT71(uStack_ff,local_100);
  local_88 = local_108;
  local_108 = 0;
  local_100 = 0;
  msg_type._M_string_length = (size_type)&my_services;
  msg_type._M_dataplus._M_p = (pointer)&local_180;
  msg_type.field_2._M_allocated_capacity._0_4_ = (int)&stack0xfffffffffffffe70;
  msg_type.field_2._M_allocated_capacity._4_4_ = (int)((ulong)&stack0xfffffffffffffe70 >> 0x20);
  msg_type.field_2._8_8_ = &nonce;
  local_110 = (long *)&local_100;
  NetMsg::
  Make<int_const&,unsigned_long&,long_const&,unsigned_long&,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long&,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long&,std::__cxx11::string&,int_const&,bool_const&>
            ((CSerializedNetMsg *)local_70,(NetMsg *)&local_90,msg_type,&PROTOCOL_VERSION,
             &my_services,&nTime,&your_services,
             (ParamsWrapper<CNetAddr::SerParams,_CService> *)&strSubVersion_abi_cxx11_,
             (unsigned_long *)&nNodeStartingHeight,
             (ParamsWrapper<CNetAddr::SerParams,_CService> *)&tx_relay,args_7,
             in_stack_fffffffffffffe68,(int *)&CNetAddr::V1,(bool *)local_138.direct);
  CConnman::PushMessage(this_00,pnode,(CSerializedNetMsg *)local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._24_8_ != &local_48) {
    operator_delete((void *)local_70._24_8_,local_48._M_allocated_capacity + 1);
  }
  if ((pointer)local_70._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ - local_70._0_8_);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (0x10 < local_128) {
    free(local_138.indirect_contents.indirect);
    local_138.indirect_contents.indirect = (char *)0x0;
  }
  if (local_110 != (long *)&local_100) {
    operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
  }
  if (fLogIPs == true) {
    pLVar3 = LogInstance();
    bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,NET,Debug);
    if (bVar1) {
      CService::ToStringAddrPort_abi_cxx11_((string *)local_70,&addr_you);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
      ;
      source_file._M_len = 0x62;
      logging_function._M_str = "PushNodeVersion";
      logging_function._M_len = 0xf;
      LogPrintFormatInternal<int,int,std::__cxx11::string,bool,long>
                (logging_function,source_file,0x68a,NET,Debug,(ConstevalFormatString<5U>)0xf9e8e5,
                 &PROTOCOL_VERSION,&nNodeStartingHeight,(string *)local_70,&tx_relay,&nodeid);
      if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
        operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
      }
    }
  }
  else {
    pLVar3 = LogInstance();
    bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,NET,Debug);
    if (bVar1) {
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
      ;
      source_file_00._M_len = 0x62;
      logging_function_00._M_str = "PushNodeVersion";
      logging_function_00._M_len = 0xf;
      LogPrintFormatInternal<int,int,bool,long>
                (logging_function_00,source_file_00,0x68c,NET,Debug,
                 (ConstevalFormatString<4U>)0xf9e930,&PROTOCOL_VERSION,&nNodeStartingHeight,
                 &tx_relay,&nodeid);
    }
  }
  if (0x10 < addr_you.super_CNetAddr.m_addr._size) {
    free(addr_you.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr_you.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
    free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::PushNodeVersion(CNode& pnode, const Peer& peer)
{
    uint64_t my_services{peer.m_our_services};
    const int64_t nTime{count_seconds(GetTime<std::chrono::seconds>())};
    uint64_t nonce = pnode.GetLocalNonce();
    const int nNodeStartingHeight{m_best_height};
    NodeId nodeid = pnode.GetId();
    CAddress addr = pnode.addr;

    CService addr_you = addr.IsRoutable() && !IsProxy(addr) && addr.IsAddrV1Compatible() ? addr : CService();
    uint64_t your_services{addr.nServices};

    const bool tx_relay{!RejectIncomingTxs(pnode)};
    MakeAndPushMessage(pnode, NetMsgType::VERSION, PROTOCOL_VERSION, my_services, nTime,
            your_services, CNetAddr::V1(addr_you), // Together the pre-version-31402 serialization of CAddress "addrYou" (without nTime)
            my_services, CNetAddr::V1(CService{}), // Together the pre-version-31402 serialization of CAddress "addrMe" (without nTime)
            nonce, strSubVersion, nNodeStartingHeight, tx_relay);

    if (fLogIPs) {
        LogDebug(BCLog::NET, "send version message: version %d, blocks=%d, them=%s, txrelay=%d, peer=%d\n", PROTOCOL_VERSION, nNodeStartingHeight, addr_you.ToStringAddrPort(), tx_relay, nodeid);
    } else {
        LogDebug(BCLog::NET, "send version message: version %d, blocks=%d, txrelay=%d, peer=%d\n", PROTOCOL_VERSION, nNodeStartingHeight, tx_relay, nodeid);
    }
}